

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowFrequencyOscillator.hpp
# Opt level: O2

void __thiscall Yamaha::OPL::LowFrequencyOscillator::update(LowFrequencyOscillator *this)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  int tremolo_levels [2];
  
  uVar3 = this->counter + 1;
  this->counter = uVar3;
  lVar1 = (long)((int)uVar3 >> 6) % 0xd2;
  iVar2 = (int)lVar1;
  tremolo_levels[0] = iVar2 >> 2;
  tremolo_levels[1] = 0x34 - (iVar2 + 1 >> 2);
  this->tremolo = tremolo_levels[(short)((short)lVar1 / 0x6b)];
  this->vibrato = uVar3 >> 10 & 7;
  return;
}

Assistant:

void update() {
			++counter;

			// This produces output of:
			//
			// four instances of 0, four instances of 1... _three_ instances of 26,
			// four instances of 25, four instances of 24... _three_ instances of 0.
			//
			// ... advancing once every 64th update.
			const int tremolo_index = (counter >> 6) % 210;
			const int tremolo_levels[2] = {tremolo_index >> 2, 52 - ((tremolo_index+1) >> 2)};
			tremolo = tremolo_levels[tremolo_index / 107];

			// Vibrato is relatively simple: it's just three bits from the counter.
			vibrato = (counter >> 10) & 7;
		}